

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O0

uint sad32x32(uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  int in_ECX;
  undefined1 (*in_RDX) [32];
  int in_ESI;
  undefined1 (*in_RDI) [32];
  undefined1 auVar3 [32];
  int i;
  __m128i sum_i128;
  __m256i sum;
  __m256i r2;
  __m256i r1;
  __m256i s2;
  __m256i s1;
  int local_2f4;
  undefined1 local_2e0 [32];
  undefined1 (*local_238) [32];
  undefined1 (*local_228) [32];
  uint local_50;
  
  local_2e0 = ZEXT1632(ZEXT816(0));
  local_238 = in_RDX;
  local_228 = in_RDI;
  for (local_2f4 = 0; local_2f4 < 0x10; local_2f4 = local_2f4 + 1) {
    auVar3 = vpsadbw_avx2(*local_238,*local_228);
    auVar2 = vpsadbw_avx2(*(undefined1 (*) [32])(*local_238 + in_ECX),
                          *(undefined1 (*) [32])(*local_228 + in_ESI));
    auVar3 = vpaddd_avx2(auVar3,auVar2);
    local_2e0 = vpaddd_avx2(local_2e0,auVar3);
    local_238 = (undefined1 (*) [32])(*local_238 + (in_ECX << 1));
    local_228 = (undefined1 (*) [32])(*local_228 + (in_ESI << 1));
  }
  auVar3 = vpsrldq_avx2(local_2e0,8);
  auVar3 = vpaddd_avx2(local_2e0,auVar3);
  auVar1 = vpaddd_avx(auVar3._16_16_,auVar3._0_16_);
  local_50 = auVar1._0_4_;
  return local_50;
}

Assistant:

static unsigned int sad32x32(const uint8_t *src_ptr, int src_stride,
                             const uint8_t *ref_ptr, int ref_stride) {
  __m256i s1, s2, r1, r2;
  __m256i sum = _mm256_setzero_si256();
  __m128i sum_i128;
  int i;

  for (i = 0; i < 16; ++i) {
    r1 = _mm256_loadu_si256((__m256i const *)ref_ptr);
    r2 = _mm256_loadu_si256((__m256i const *)(ref_ptr + ref_stride));
    s1 = _mm256_sad_epu8(r1, _mm256_loadu_si256((__m256i const *)src_ptr));
    s2 = _mm256_sad_epu8(
        r2, _mm256_loadu_si256((__m256i const *)(src_ptr + src_stride)));
    sum = _mm256_add_epi32(sum, _mm256_add_epi32(s1, s2));
    ref_ptr += ref_stride << 1;
    src_ptr += src_stride << 1;
  }

  sum = _mm256_add_epi32(sum, _mm256_srli_si256(sum, 8));
  sum_i128 = _mm_add_epi32(_mm256_extracti128_si256(sum, 1),
                           _mm256_castsi256_si128(sum));
  return (unsigned int)_mm_cvtsi128_si32(sum_i128);
}